

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O2

int clear_mark(int tag_mark,int max_mark,int n_row,Colamd_Row *Row)

{
  ulong uVar1;
  ulong uVar2;
  
  if (tag_mark < 1 || max_mark <= tag_mark) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)n_row;
    if (n_row < 1) {
      uVar1 = uVar2;
    }
    tag_mark = 1;
    for (; uVar1 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
      if (-1 < *(int *)((long)&Row->shared2 + uVar2)) {
        *(undefined4 *)((long)&Row->shared2 + uVar2) = 0;
      }
    }
  }
  return tag_mark;
}

Assistant:

PRIVATE Int clear_mark	/* return the new value for tag_mark */
(
    /* === Parameters ======================================================= */

    Int tag_mark,	/* new value of tag_mark */
    Int max_mark,	/* max allowed value of tag_mark */

    Int n_row,		/* number of rows in A */
    Colamd_Row Row []	/* Row [0 ... n_row-1].shared2.mark is set to zero */
)
{
    /* === Local variables ================================================== */

    Int r ;

    if (tag_mark <= 0 || tag_mark >= max_mark)
    {
	for (r = 0 ; r < n_row ; r++)
	{
	    if (ROW_IS_ALIVE (r))
	    {
		Row [r].shared2.mark = 0 ;
	    }
	}
	tag_mark = 1 ;
    }

    return (tag_mark) ;
}